

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

Result __thiscall tonk::gateway::AsioHost::Initialize(AsioHost *this)

{
  unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *this_00;
  mutex *__mutex;
  io_context *__ptr;
  impl_type *piVar1;
  strand *psVar2;
  _Head_base<0UL,_asio::io_context_*,_false> _Var3;
  strand *this_01;
  pointer __p;
  waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
  *pwVar4;
  thread *this_02;
  StateMachine *pSVar5;
  AsioHost *in_RSI;
  AsioHost *local_40;
  key local_38;
  
  _Var3._M_head_impl = (io_context *)operator_new(0x10,(nothrow_t *)&std::nothrow);
  if (_Var3._M_head_impl != (io_context *)0x0) {
    asio::io_context::io_context(_Var3._M_head_impl);
  }
  __ptr = (in_RSI->Context)._M_t.
          super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
          super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
          super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
  this_00 = &in_RSI->Context;
  (in_RSI->Context)._M_t.
  super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
  super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (__ptr != (io_context *)0x0) {
    std::default_delete<asio::io_context>::operator()
              ((default_delete<asio::io_context> *)this_00,__ptr);
    _Var3._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
         super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
         super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
  }
  if (_Var3._M_head_impl != (io_context *)0x0) {
    piVar1 = (_Var3._M_head_impl)->impl_;
    __mutex = &piVar1->mutex_;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    piVar1->stopped_ = false;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Var3._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
         super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
         super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
    this_01 = (strand *)operator_new(0x10,(nothrow_t *)&std::nothrow);
    if (this_01 != (strand *)0x0) {
      asio::io_context::strand::strand(this_01,_Var3._M_head_impl);
    }
    psVar2 = (in_RSI->AsioEventStrand)._M_t.
             super___uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
             ._M_t.
             super__Tuple_impl<0UL,_asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>
             .super__Head_base<0UL,_asio::io_context::strand_*,_false>._M_head_impl;
    (in_RSI->AsioEventStrand)._M_t.
    super___uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>.
    _M_t.
    super__Tuple_impl<0UL,_asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>
    .super__Head_base<0UL,_asio::io_context::strand_*,_false>._M_head_impl = this_01;
    if (psVar2 != (strand *)0x0) {
      operator_delete(psVar2);
    }
    _Var3._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
         super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
         super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
    __p = (pointer)operator_new(0x40,(nothrow_t *)&std::nothrow);
    if (__p != (pointer)0x0) {
      local_38.type_info_ =
           (type_info *)
           &asio::detail::
            typeid_wrapper<asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
            ::typeinfo;
      local_38.id_ = (id *)0x0;
      pwVar4 = (waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
                *)asio::detail::service_registry::do_use_service
                            (((_Var3._M_head_impl)->super_execution_context).service_registry_,
                             &local_38,
                             asio::detail::service_registry::
                             create<asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>,asio::io_context>
                             ,_Var3._M_head_impl);
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).service_ = pwVar4;
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).implementation_.timer_data.op_queue_.front_ = (wait_op *)0x0;
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).implementation_.timer_data.op_queue_.back_ = (wait_op *)0x0;
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).implementation_.timer_data.heap_index_ = 0xffffffffffffffff;
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).implementation_.timer_data.next_ = (per_timer_data *)0x0;
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).implementation_.timer_data.prev_ = (per_timer_data *)0x0;
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).implementation_.expiry.__d.__r = 0;
      (__p->
      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
      ).implementation_.might_have_pending_waits = false;
    }
    std::
    __uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
    ::reset((__uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
             *)&in_RSI->Ticker,__p);
    if (((in_RSI->Ticker)._M_t.
         super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
         .
         super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
         ._M_head_impl !=
         (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *)0x0) &&
       ((in_RSI->AsioEventStrand)._M_t.
        super___uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
        ._M_t.
        super__Tuple_impl<0UL,_asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>
        .super__Head_base<0UL,_asio::io_context::strand_*,_false>._M_head_impl != (strand *)0x0)) {
      TickAndPostNextTimer(in_RSI);
      LOCK();
      (in_RSI->Terminated)._M_base._M_i = false;
      UNLOCK();
      local_38.type_info_ = (type_info *)WorkerLoop;
      local_38.id_ = (id *)0x0;
      this_02 = (thread *)operator_new(8,(nothrow_t *)&std::nothrow);
      if (this_02 != (thread *)0x0) {
        std::thread::thread<void(tonk::gateway::AsioHost::*)(),tonk::gateway::AsioHost*,void>
                  (this_02,(offset_in_AsioHost_to_subr *)&local_38,&local_40);
      }
      std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
                ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)
                 &in_RSI->AsioThread,this_02);
      if ((in_RSI->AsioThread)._M_t.
          super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
          super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
          super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
        pSVar5 = (StateMachine *)0x0;
        goto LAB_00137f3a;
      }
    }
  }
  pSVar5 = (StateMachine *)operator_new(0x38);
  pSVar5->Host = (AsioHost *)"Out of memory";
  pSVar5->SSDP = (SSDPRequester *)((long)&(pSVar5->API_Lock).super___mutex_base._M_mutex + 8);
  (pSVar5->API_Lock).super___mutex_base._M_mutex.__align = 0;
  (pSVar5->API_Lock).super___mutex_base._M_mutex.__size[8] = '\0';
  *(undefined4 *)((long)&(pSVar5->API_Lock).super___mutex_base._M_mutex + 0x18) = 0;
  (pSVar5->API_Lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x10;
LAB_00137f3a:
  this->State = pSVar5;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result AsioHost::Initialize()
{
    Context = MakeUniqueNoThrow<asio::io_context>();
    if (!Context) {
        return Result::OutOfMemory();
    }
    Context->restart();

    AsioEventStrand = MakeUniqueNoThrow<asio::io_context::strand>(*Context);
    Ticker = MakeUniqueNoThrow<asio::steady_timer>(*Context);
    if (!Ticker || !AsioEventStrand) {
        return Result::OutOfMemory();
    }

    /*
        Asio bug work-around: If we do not keep some work queued for Asio it
        will internally call stop() for some reason and then use a ton of
        CPU expecting us to end our worker threads.  The best way I've found
        to prevent the work-queue to go to 0 items is to keep a timer queued
        from before the first worker starts running.  The timer OnTick()
        keeps re-queuing a timer tick so the work-queue is never empty.
    */
    TickAndPostNextTimer();

    Terminated = false;
    AsioThread = MakeUniqueNoThrow<std::thread>(&AsioHost::WorkerLoop, this);
    if (!AsioThread) {
        return Result::OutOfMemory();
    }

    return Result::Success();
}